

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O1

void __thiscall
midi_container::trim_range_of_tracks(midi_container *this,unsigned_long start,unsigned_long end)

{
  pointer pmVar1;
  pointer puVar2;
  unsigned_long uVar3;
  ulong base_timestamp;
  ulong *puVar4;
  long lVar5;
  ulong uVar6;
  
  base_timestamp = 0xffffffffffffffff;
  if (start <= end) {
    pmVar1 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = start;
    do {
      puVar4 = *(ulong **)
                &pmVar1[uVar3].m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>.
                 _M_impl;
      lVar5 = (long)*(pointer *)
                     ((long)&pmVar1[uVar3].m_events.
                             super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8
                     ) - (long)puVar4;
      if (lVar5 != 0) {
        lVar5 = lVar5 >> 6;
        lVar5 = lVar5 + (ulong)(lVar5 == 0);
        do {
          if (((int)puVar4[1] == 1) && ((char)puVar4[3] != '\0')) {
            if (*puVar4 < base_timestamp) {
              base_timestamp = *puVar4;
            }
            break;
          }
          puVar4 = puVar4 + 8;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= end);
  }
  if (base_timestamp - 1 < 0xfffffffffffffffe) {
    if (start <= end) {
      pmVar1 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = start;
      do {
        puVar4 = *(ulong **)
                  &pmVar1[uVar3].m_events.
                   super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
        lVar5 = (long)*(pointer *)
                       ((long)&pmVar1[uVar3].m_events.
                               super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                       8) - (long)puVar4;
        if (lVar5 != 0) {
          lVar5 = lVar5 >> 6;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          do {
            uVar6 = *puVar4 - base_timestamp;
            if (*puVar4 < base_timestamp) {
              uVar6 = 0;
            }
            *puVar4 = uVar6;
            puVar4 = puVar4 + 8;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 <= end);
    }
    if (start == end) {
      trim_tempo_map(this,start,base_timestamp);
      puVar2 = (this->m_timestamp_end).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + start;
      *puVar2 = *puVar2 - base_timestamp;
      puVar2 = (this->m_timestamp_loop_end).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar2[start];
      if (uVar3 != 0xffffffffffffffff) {
        puVar2[start] = uVar3 - base_timestamp;
      }
      puVar2 = (this->m_timestamp_loop_start).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = puVar2[start];
      if (uVar6 != 0xffffffffffffffff) {
        if (uVar6 < base_timestamp || uVar6 - base_timestamp == 0) {
          puVar2[start] = 0;
        }
        else {
          puVar2[start] = uVar6 - base_timestamp;
        }
      }
    }
    else {
      trim_tempo_map(this,0,base_timestamp);
      puVar2 = (this->m_timestamp_end).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      *puVar2 = *puVar2 - base_timestamp;
      puVar2 = (this->m_timestamp_loop_end).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = *puVar2;
      if (uVar3 != 0xffffffffffffffff) {
        *puVar2 = uVar3 - base_timestamp;
      }
      puVar4 = (this->m_timestamp_loop_start).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = *puVar4;
      if (uVar6 != 0xffffffffffffffff) {
        if (uVar6 < base_timestamp || uVar6 - base_timestamp == 0) {
          *puVar4 = 0;
        }
        else {
          *puVar4 = uVar6 - base_timestamp;
        }
      }
    }
  }
  return;
}

Assistant:

void midi_container::trim_range_of_tracks(unsigned long start, unsigned long end)
{
    unsigned long timestamp_first_note = ~0UL;

    for (unsigned long i = start; i <= end; ++i)
    {
        unsigned long j, k;

        const midi_track & track = m_tracks[ i ];

        for (j = 0, k = track.get_count(); j < k; ++j)
        {
            const midi_event & event = track[ j ];

            if ( event.m_type == midi_event::note_on && event.m_data[ 0 ] )
                break;
        }

        if ( j < k )
        {
            if ( track[ j ].m_timestamp < timestamp_first_note )
                timestamp_first_note = track[ j ].m_timestamp;
        }
    }

    if ( timestamp_first_note < ~0UL && timestamp_first_note > 0 )
    {
        for (unsigned long i = start; i <= end; ++i)
        {
            midi_track & track = m_tracks[ i ];

            for (unsigned long j = 0, k = track.get_count(); j < k; ++j)
            {
                midi_event & event = track[ j ];
                if ( event.m_timestamp >= timestamp_first_note )
                    event.m_timestamp -= timestamp_first_note;
                else
                    event.m_timestamp = 0;
            }
        }

        if ( start == end )
        {
            trim_tempo_map( start, timestamp_first_note );

            m_timestamp_end[ start ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ start ] != ~0UL )
                m_timestamp_loop_end[ start ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ start ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ start ] > timestamp_first_note )
                    m_timestamp_loop_start[ start ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ start ] = 0;
            }
        }
        else
        {
            trim_tempo_map( 0, timestamp_first_note );

            m_timestamp_end[ 0 ] -= timestamp_first_note;

            if ( m_timestamp_loop_end[ 0 ] != ~0UL )
                m_timestamp_loop_end[ 0 ] -= timestamp_first_note;
            if ( m_timestamp_loop_start[ 0 ] != ~0UL )
            {
                if ( m_timestamp_loop_start[ 0 ] > timestamp_first_note )
                    m_timestamp_loop_start[ 0 ] -= timestamp_first_note;
                else
                    m_timestamp_loop_start[ 0 ] = 0;
            }
        }
    }
}